

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGraphBenchmark.cpp
# Opt level: O2

void __thiscall
RandomGraphBenchmark::run(RandomGraphBenchmark *this,unsigned_long deletions,unsigned_long queries)

{
  ostream *poVar1;
  invalid_argument *this_00;
  double dVar2;
  double extraout_XMM0_Qa;
  
  if (deletions <=
      (this->super_Benchmark).G.super_UndirectedGraph.super_type.m_edges.
      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
      ._M_impl._M_node._M_size) {
    poVar1 = std::operator<<((ostream *)&std::cout,"[i] random graph initialization time: ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
    dVar2 = Benchmark::getInitTime(&this->super_Benchmark);
    std::ostream::_M_insert<double>(dVar2);
    poVar1 = std::operator<<((ostream *)&std::cout," seconds (");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," vertices ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," edges)");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"[i] random graph deletion time: ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
    (**(this->super_Benchmark)._vptr_Benchmark)(this,deletions);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa);
    poVar1 = std::operator<<((ostream *)&std::cout," seconds (");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," deletions)");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"[i] random graph query time: ");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
    dVar2 = Benchmark::getQueryTime(&this->super_Benchmark,queries);
    std::ostream::_M_insert<double>(dVar2);
    poVar1 = std::operator<<((ostream *)&std::cout," seconds (");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," queries)");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"RandomGraphBenchmark: Too many deletions");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void RandomGraphBenchmark::run(unsigned long deletions, unsigned long queries)
{
    if (deletions > num_edges(G)) {
        throw std::invalid_argument("RandomGraphBenchmark: Too many deletions");
    }

    std::cout << "[i] random graph initialization time: " << std::fixed << this->getInitTime();
    std::cout << " seconds (" << num_vertices(G) << " vertices " << num_edges(G) << " edges)" << std::endl;
    std::cout << "[i] random graph deletion time: " << std::fixed << this->getDeletionsTime(deletions);
    std::cout << " seconds (" << deletions << " deletions)" << std::endl;
    std::cout << "[i] random graph query time: " << std::fixed << this->getQueryTime(queries);
    std::cout << " seconds (" << queries << " queries)" << std::endl;
}